

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::internal::
Hasher<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::Int64
          (Hasher<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           *this,int64_t i)

{
  bool bVar1;
  U local_28;
  Number n;
  int64_t i_local;
  Hasher<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_local;
  
  n.u = (U)(double)i;
  local_28.i = i;
  n.d = (double)i;
  bVar1 = WriteNumber(this,(Number *)&local_28);
  return bVar1;
}

Assistant:

bool Int64(int64_t i) { Number n; n.u.i = i; n.d = static_cast<double>(i); return WriteNumber(n); }